

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

string * __thiscall
deqp::gls::getShaderInfoLog_abi_cxx11_(string *__return_storage_ptr__,gls *this,deUint32 shaderGL)

{
  pointer pcVar1;
  size_t sVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  char *pcVar4;
  int infoLogLen;
  vector<char,_std::allocator<char>_> infoLog;
  GLint local_3c;
  vector<char,_std::allocator<char>_> local_38;
  
  local_3c = 0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (GLchar *)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glwGetShaderiv((GLuint)this,0x8b84,&local_3c);
  std::vector<char,_std::allocator<char>_>::resize(&local_38,(long)(local_3c + 1));
  glwGetShaderInfoLog((GLuint)this,
                      (int)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                      (int)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,(GLsizei *)0x0,
                      local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  pcVar1 = local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (char *)0x0) {
    pcVar4 = &DAT_00000001;
  }
  else {
    sVar2 = strlen(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    pcVar4 = pcVar1 + sVar2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar4);
  psVar3 = extraout_RAX;
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

static inline string getShaderInfoLog (const deUint32 shaderGL)
{
	int				infoLogLen = 0;
	vector<char>	infoLog;
	glGetShaderiv(shaderGL, GL_INFO_LOG_LENGTH, &infoLogLen);
	infoLog.resize(infoLogLen+1);
	glGetShaderInfoLog(shaderGL, (int)infoLog.size(), DE_NULL, &infoLog[0]);
	return &infoLog[0];
}